

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<int>::append(SmallVectorBase<int> *this,size_type count,int *value)

{
  int *__first;
  undefined4 *in_RDX;
  long in_RSI;
  SmallVectorBase<int> *in_RDI;
  size_type newSize;
  int temp;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  uVar1 = *in_RDX;
  __first = (int *)(in_RDI->len + in_RSI);
  reserve((SmallVectorBase<int> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(size_type)__first);
  end(in_RDI);
  std::ranges::__uninitialized_fill_n_fn::operator()<int_*,_int>
            ((__uninitialized_fill_n_fn *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),__first,
             (iter_difference_t<int_*>)in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->len = (size_type)__first;
  return;
}

Assistant:

void append(size_type count, const T& value) {
        // Make a temporary copy of the value in case it already lives inside our array.
        T temp(value);

        auto newSize = len + count;
        reserve(newSize);

        std::ranges::uninitialized_fill_n(end(), count, temp);
        len = newSize;
    }